

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

int has_segment_link(mstate m,msegmentptr ss)

{
  malloc_segment *local_28;
  msegmentptr sp;
  msegmentptr ss_local;
  mstate m_local;
  
  local_28 = &m->seg;
  while ((local_28 < (malloc_segment *)ss->base ||
         ((malloc_segment *)(ss->base + ss->size) <= local_28))) {
    local_28 = local_28->next;
    if (local_28 == (malloc_segment *)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int has_segment_link(mstate m, msegmentptr ss) {
  msegmentptr sp = &m->seg;
  for (;;) {
    if ((char*)sp >= ss->base && (char*)sp < ss->base + ss->size)
      return 1;
    if ((sp = sp->next) == 0)
      return 0;
  }
}